

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

Data * DL::Expressions::print_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  bool bVar1;
  SourceLogger *pSVar2;
  allocator local_219;
  string local_218 [32];
  string local_1f8 [48];
  reference local_1c8;
  Data *d;
  const_iterator __end2;
  const_iterator __begin2;
  vector_t<Data> *__range2;
  stringstream stream;
  VM *vm_local;
  vector_t<Data> *args_local;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
  __end2 = std::vector<DL::Data,_std::allocator<DL::Data>_>::begin(args);
  d = (Data *)std::vector<DL::Data,_std::allocator<DL::Data>_>::end(args);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                *)&d);
    if (!bVar1) break;
    local_1c8 = __gnu_cxx::
                __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                ::operator*(&__end2);
    print_val(local_1c8,(stringstream *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
    operator++(&__end2);
  }
  pSVar2 = VM::logger(vm);
  std::__cxx11::stringstream::str();
  (*pSVar2->_vptr_SourceLogger[3])(pSVar2,1,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"",&local_219);
  Data::Data(__return_storage_ptr__,(string_t *)local_218);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

Data print_func(const vector_t<Data>& args, VM& vm)
{
	std::stringstream stream;

	for (const Data& d : args)
		print_val(d, stream);

	vm.logger()->log(L_Info, stream.str());
	return Data();
}